

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier.cc
# Opt level: O0

int webrtc::RealFourier::FftOrder(size_t length)

{
  int16_t iVar1;
  FatalMessage local_198;
  uint local_1c;
  string *local_18;
  string *_result;
  size_t length_local;
  
  local_1c = 0;
  _result = (string *)length;
  local_18 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       ((unsigned_long *)&_result,&local_1c,"length > 0U");
  if (local_18 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/real_fourier.cc"
               ,0x21,local_18);
    rtc::FatalMessage::stream(&local_198);
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  iVar1 = WebRtcSpl_GetSizeInBits((int)_result - 1);
  return (int)iVar1;
}

Assistant:

int RealFourier::FftOrder(size_t length) {
  RTC_CHECK_GT(length, 0U);
  return WebRtcSpl_GetSizeInBits(static_cast<uint32_t>(length - 1));
}